

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O3

bool __thiscall Hpipe::Cond::always_checked(Cond *this,Cond *not_in)

{
  long lVar1;
  ulong uVar2;
  
  if (not_in == (Cond *)0x0) {
    lVar1 = 0;
    while ((this->p).super__Base_bitset<4UL>._M_w[lVar1] == 0xffffffffffffffff) {
      lVar1 = lVar1 + 1;
      if (lVar1 == 3) {
        return (this->p).super__Base_bitset<4UL>._M_w[3] == 0xffffffffffffffff;
      }
    }
  }
  else {
    uVar2 = 0xffffffffffffffff;
    while( true ) {
      uVar2 = uVar2 + 1;
      if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) &&
         (((this->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] & 1L << ((byte)uVar2 & 0x3f)) == 0))
      break;
      if (uVar2 == 0xff) {
        return 0xfe < uVar2;
      }
    }
  }
  return false;
}

Assistant:

bool Cond::always_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and not p[ i ] )
                return false;
        return true;
    }
    return p.all();
}